

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_23::digest_asmcode(asmcode *code)

{
  asmcode *code_local;
  
  return;
}

Assistant:

void digest_asmcode(const asmcode& code)
    {
    (void)code;
#ifdef PRINT_OUT_REGISTERS_AND_OPERANDS
    for (const auto& instruction_vector : code.get_instructions_list())
      {
      for (const auto& instr : instruction_vector)
        {
        operations.push_back(instr.oper);
        if (instr.operand1 != asmcode::EMPTY)
          operands.push_back(instr.operand1);
        if (instr.operand2 != asmcode::EMPTY)
          operands.push_back(instr.operand2);
        if (instr.operand3 != asmcode::EMPTY)
          operands.push_back(instr.operand3);
        if (instr.operand4 != asmcode::EMPTY)
          operands.push_back(instr.operand4);
        }
      }
#endif
    }